

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O2

void anon_unknown.dwarf_7074::GetWindowedWaveform
               (double *x,int x_length,int fs,double current_f0,double current_position,
               int window_type,double window_length_ratio,double *waveform,RandnState *randn_state)

{
  int i_3;
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int i;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar10 = (double)fs;
  iVar1 = matlab_round(((dVar10 * window_length_ratio) / current_f0) * 0.5);
  uVar7 = iVar1 * 2 + 1;
  uVar8 = (long)(int)uVar7 << 3;
  uVar6 = (long)(int)uVar7 * 4;
  if (iVar1 < 0) {
    uVar8 = 0xffffffffffffffff;
    uVar6 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar6);
  pvVar3 = operator_new__(uVar6);
  pvVar4 = operator_new__(uVar8);
  for (lVar5 = (long)-iVar1; lVar5 <= iVar1; lVar5 = lVar5 + 1) {
    *(int *)((long)pvVar2 + lVar5 * 4 + (long)iVar1 * 4) = (int)lVar5;
  }
  iVar1 = matlab_round(current_position * dVar10 + 0.001);
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  uVar8 = (ulong)uVar7;
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    iVar9 = *(int *)((long)pvVar2 + uVar6 * 4) + iVar1;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (x_length + -1 < iVar9) {
      iVar9 = x_length + -1;
    }
    *(int *)((long)pvVar3 + uVar6 * 4) = iVar9;
  }
  if (window_type == 1) {
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      dVar11 = (double)*(int *)((long)pvVar2 + uVar6 * 4);
      dVar11 = cos((((dVar11 + dVar11) / window_length_ratio) / dVar10) * 3.141592653589793 *
                   current_f0);
      *(double *)((long)pvVar4 + uVar6 * 8) = dVar11 * 0.5 + 0.5;
    }
  }
  else {
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      dVar11 = (double)*(int *)((long)pvVar2 + uVar6 * 4);
      dVar11 = (((dVar11 + dVar11) / window_length_ratio) / dVar10) * 3.141592653589793 * current_f0
      ;
      dVar12 = cos(dVar11);
      dVar11 = cos(dVar11 + dVar11);
      *(double *)((long)pvVar4 + uVar6 * 8) = dVar11 * 0.08 + dVar12 * 0.5 + 0.42;
    }
  }
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    dVar10 = x[*(int *)((long)pvVar3 + uVar6 * 4)];
    dVar11 = *(double *)((long)pvVar4 + uVar6 * 8);
    dVar12 = randn(randn_state);
    waveform[uVar6] = dVar12 * 1e-06 + dVar10 * dVar11;
  }
  dVar10 = 0.0;
  dVar11 = 0.0;
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    dVar10 = dVar10 + waveform[uVar6];
    dVar11 = dVar11 + *(double *)((long)pvVar4 + uVar6 * 8);
  }
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    waveform[uVar6] = waveform[uVar6] - *(double *)((long)pvVar4 + uVar6 * 8) * (dVar10 / dVar11);
  }
  operator_delete__(pvVar2);
  operator_delete__(pvVar3);
  operator_delete__(pvVar4);
  return;
}

Assistant:

static void GetWindowedWaveform(const double *x, int x_length, int fs,
    double current_f0, double current_position, int window_type,
    double window_length_ratio, double *waveform, RandnState *randn_state) {
  int half_window_length =
    matlab_round(window_length_ratio * fs / current_f0 / 2.0);

  int *base_index = new int[half_window_length * 2 + 1];
  int *safe_index = new int[half_window_length * 2 + 1];
  double *window  = new double[half_window_length * 2 + 1];

  SetParametersForGetWindowedWaveform(half_window_length, x_length,
      current_position, fs, current_f0, window_type, window_length_ratio,
      base_index, safe_index, window);

  // F0-adaptive windowing
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] =
      x[safe_index[i]] * window[i] + randn(randn_state) * world::kSafeGuardD4C;

  double tmp_weight1 = 0;
  double tmp_weight2 = 0;
  for (int i = 0; i <= half_window_length * 2; ++i) {
    tmp_weight1 += waveform[i];
    tmp_weight2 += window[i];
  }
  double weighting_coefficient = tmp_weight1 / tmp_weight2;
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] -= window[i] * weighting_coefficient;

  delete[] base_index;
  delete[] safe_index;
  delete[] window;
}